

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void os_wrapper_test(void)

{
  int status;
  ostream *poVar1;
  allocator<char> local_31;
  string local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"before remove");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"remove file",&local_31);
  status = remove("/this/file/does/not/exist");
  QUtil::os_wrapper(&local_30,status);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"after remove");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
os_wrapper_test()
{
    try {
        std::cout << "before remove" << std::endl;
        QUtil::os_wrapper("remove file", remove("/this/file/does/not/exist"));
        std::cout << "after remove" << std::endl;
    } catch (std::runtime_error& s) {
        std::cout << "exception: " << s.what() << std::endl;
    }
}